

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_enable_universal_weight(mcpl_outfile_t of,double w)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  mcpl_outfile_t in_XMM0_Qa;
  mcpl_outfileinternal_t *f;
  
  if (0.0 < (double)in_XMM0_Qa.internal) {
    iVar2 = 1;
    if ((long)in_XMM0_Qa.internal < 0) {
      iVar2 = -1;
    }
    iVar1 = 0;
    if (ABS((double)in_XMM0_Qa.internal) == INFINITY) {
      iVar1 = iVar2;
    }
    if ((iVar1 == 0) && (!NAN((double)in_XMM0_Qa.internal))) goto LAB_001021bc;
  }
  mcpl_error((char *)0x1021bc);
LAB_001021bc:
  if ((*(double *)(in_RDI + 0x58) != 0.0) || (NAN(*(double *)(in_RDI + 0x58)))) {
    if ((*(double *)(in_RDI + 0x58) != (double)in_XMM0_Qa.internal) ||
       (NAN(*(double *)(in_RDI + 0x58)) || NAN((double)in_XMM0_Qa.internal))) {
      mcpl_error((char *)0x1021f3);
    }
  }
  else {
    if (*(int *)(in_RDI + 0x60) == 0) {
      mcpl_error((char *)0x10220b);
    }
    *(void **)(in_RDI + 0x58) = in_XMM0_Qa.internal;
    mcpl_recalc_psize(in_XMM0_Qa);
  }
  return;
}

Assistant:

void mcpl_enable_universal_weight(mcpl_outfile_t of, double w)
{
  MCPLIMP_OUTFILEDECODE;
  if (w<=0.0||isinf(w)||isnan(w))
    mcpl_error("mcpl_enable_universal_weight must be called with positive but finite weight.");
  if (f->opt_universalweight) {
    if (f->opt_universalweight!=w)
      mcpl_error("mcpl_enable_universal_weight called multiple times");
    return;
  }
  if (!f->header_notwritten)
    mcpl_error("mcpl_enable_universal_weight called too late.");
  f->opt_universalweight = w;
  mcpl_recalc_psize(of);
}